

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

symbol * Symbol_Nth(int n)

{
  symbol *data;
  int n_local;
  
  if (((x2a == (s_x2 *)0x0) || (n < 1)) || (x2a->count < n)) {
    data = (symbol *)0x0;
  }
  else {
    data = x2a->tbl[n + -1].data;
  }
  return data;
}

Assistant:

struct symbol *Symbol_Nth(int n)
{
  struct symbol *data;
  if( x2a && n>0 && n<=x2a->count ){
    data = x2a->tbl[n-1].data;
  }else{
    data = 0;
  }
  return data;
}